

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
       ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                 (redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *eval,
                 scalar_min_op<double,_double,_0> *func,Matrix<double,__1,_1,_0,__1,_1> *xpr)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  double dVar3;
  Index index;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  Scalar elements [2];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar1 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar4 = 4;
  pauVar2 = (undefined1 (*) [16])
            (eval->super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data;
  if (lVar1 + 1U < 3) {
    dVar7 = *(double *)*pauVar2;
    for (lVar4 = 1; lVar4 < lVar1; lVar4 = lVar4 + 1) {
      dVar3 = *(double *)(*pauVar2 + lVar4 * 8);
      if (dVar7 <= *(double *)(*pauVar2 + lVar4 * 8)) {
        dVar3 = dVar7;
      }
      dVar7 = dVar3;
    }
  }
  else {
    lVar5 = (lVar1 / 2) * 2;
    auVar8 = *pauVar2;
    if (3 < lVar1) {
      lVar6 = (lVar1 / 4) * 4;
      auVar9 = pauVar2[1];
      for (; lVar4 < lVar6; lVar4 = lVar4 + 4) {
        auVar8 = minpd(*(undefined1 (*) [16])(*pauVar2 + lVar4 * 8),auVar8);
        auVar9 = minpd(*(undefined1 (*) [16])(pauVar2[1] + lVar4 * 8),auVar9);
      }
      auVar8 = minpd(auVar9,auVar8);
      if (lVar6 < lVar5) {
        auVar8 = minpd(pauVar2[(lVar1 / 4) * 2],auVar8);
      }
    }
    dVar7 = auVar8._8_8_;
    if (auVar8._0_8_ <= auVar8._8_8_) {
      dVar7 = auVar8._0_8_;
    }
    for (; lVar5 < lVar1; lVar5 = lVar5 + 1) {
      dVar3 = *(double *)(*pauVar2 + lVar5 * 8);
      if (dVar7 <= *(double *)(*pauVar2 + lVar5 * 8)) {
        dVar3 = dVar7;
      }
      dVar7 = dVar3;
    }
  }
  return dVar7;
}

Assistant:

EIGEN_DEVICE_FUNC Index rows(void) const EIGEN_NOEXCEPT {return m_rows;}